

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O0

int jacrob(sunrealtype tt,sunrealtype cj,N_Vector yy,N_Vector yp,N_Vector resvec,SUNMatrix JJ,
          void *user_data,N_Vector tempv1,N_Vector tempv2,N_Vector tempv3)

{
  long lVar1;
  long *in_RCX;
  undefined8 in_RDI;
  double in_XMM1_Qa;
  sunrealtype *yval;
  
  lVar1 = N_VGetArrayPointer(in_RDI);
  *(double *)**(undefined8 **)(*in_RCX + 0x20) = -0.04 - in_XMM1_Qa;
  *(undefined8 *)(**(long **)(*in_RCX + 0x20) + 8) = 0x3fa47ae147ae147b;
  *(undefined8 *)(**(long **)(*in_RCX + 0x20) + 0x10) = 0x3ff0000000000000;
  **(double **)(*(long *)(*in_RCX + 0x20) + 8) = *(double *)(lVar1 + 0x10) * 10000.0;
  *(double *)(*(long *)(*(long *)(*in_RCX + 0x20) + 8) + 8) =
       (*(double *)(lVar1 + 0x10) * -10000.0 + -(*(double *)(lVar1 + 8) * 60000000.0)) - in_XMM1_Qa;
  *(undefined8 *)(*(long *)(*(long *)(*in_RCX + 0x20) + 8) + 0x10) = 0x3ff0000000000000;
  **(double **)(*(long *)(*in_RCX + 0x20) + 0x10) = *(double *)(lVar1 + 8) * 10000.0;
  *(double *)(*(long *)(*(long *)(*in_RCX + 0x20) + 0x10) + 8) = *(double *)(lVar1 + 8) * -10000.0;
  *(undefined8 *)(*(long *)(*(long *)(*in_RCX + 0x20) + 0x10) + 0x10) = 0x3ff0000000000000;
  return 0;
}

Assistant:

int jacrob(sunrealtype tt, sunrealtype cj, N_Vector yy, N_Vector yp,
           N_Vector resvec, SUNMatrix JJ, void* user_data, N_Vector tempv1,
           N_Vector tempv2, N_Vector tempv3)
{
  sunrealtype* yval;

  yval = N_VGetArrayPointer(yy);

  IJth(JJ, 1, 1) = SUN_RCONST(-0.04) - cj;
  IJth(JJ, 2, 1) = SUN_RCONST(0.04);
  IJth(JJ, 3, 1) = ONE;
  IJth(JJ, 1, 2) = SUN_RCONST(1.0e4) * yval[2];
  IJth(JJ, 2, 2) = SUN_RCONST(-1.0e4) * yval[2] - SUN_RCONST(6.0e7) * yval[1] -
                   cj;
  IJth(JJ, 3, 2) = ONE;
  IJth(JJ, 1, 3) = SUN_RCONST(1.0e4) * yval[1];
  IJth(JJ, 2, 3) = SUN_RCONST(-1.0e4) * yval[1];
  IJth(JJ, 3, 3) = ONE;

  return (0);
}